

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_custom_secret_storage.cpp
# Opt level: O2

void __thiscall
TestSecretStorage::TestSecretStorage
          (TestSecretStorage *this,string *name_p,DatabaseInstance *db,TestSecretLog *logger_p,
          int64_t tie_break_offset_p)

{
  _Head_base<0UL,_duckdb::CatalogSet_*,_false> __p;
  Catalog *args;
  _Head_base<0UL,_duckdb::CatalogSet_*,_false> local_20;
  
  duckdb::CatalogSetSecretStorage::CatalogSetSecretStorage
            (&this->super_CatalogSetSecretStorage,db,name_p,tie_break_offset_p);
  *(undefined ***)this = &PTR__CatalogSetSecretStorage_00573488;
  this->logger = logger_p;
  args = (Catalog *)duckdb::Catalog::GetSystemCatalog(db);
  duckdb::make_uniq<duckdb::CatalogSet,duckdb::Catalog&>((duckdb *)&local_20,args);
  __p._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (CatalogSet *)0x0;
  std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &this->field_0x38,__p._M_head_impl);
  std::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::~unique_ptr
            ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)&local_20);
  this->field_0x30 = 1;
  this->include_in_lookups = true;
  return;
}

Assistant:

TestSecretStorage(const string &name_p, DatabaseInstance &db, TestSecretLog &logger_p, int64_t tie_break_offset_p)
	    : CatalogSetSecretStorage(db, name_p, tie_break_offset_p), logger(logger_p) {
		secrets = make_uniq<CatalogSet>(Catalog::GetSystemCatalog(db));
		persistent = true;
		include_in_lookups = true;
	}